

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

Object * xt::vector::nth(Object *__return_storage_ptr__,Vector *v,uint i,Object *notFound)

{
  element_type *peVar1;
  shared_ptr<xt::_Vector> local_38;
  Object *local_28;
  Object *notFound_local;
  Vector *pVStack_18;
  uint i_local;
  Vector *v_local;
  
  local_28 = notFound;
  notFound_local._4_4_ = i;
  pVStack_18 = v;
  v_local = (Vector *)__return_storage_ptr__;
  peVar1 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      v);
  if (i < peVar1->cnt) {
    std::shared_ptr<xt::_Vector>::shared_ptr(&local_38,v);
    nth(__return_storage_ptr__,&local_38,notFound_local._4_4_);
    std::shared_ptr<xt::_Vector>::~shared_ptr(&local_38);
  }
  else {
    Object::Object(__return_storage_ptr__,notFound);
  }
  return __return_storage_ptr__;
}

Assistant:

Object nth(Vector v, unsigned int i, Object notFound) {
	if (i < v->cnt) return nth(v, i);
	return notFound;
}